

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

pair<sjtu::map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>::iterator,_bool>
* __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
::insert(pair<sjtu::map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>::iterator,_bool>
         *__return_storage_ptr__,
        map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
        *this,value_type *value)

{
  Node *pNVar1;
  long lVar2;
  CacheNode *pCVar3;
  Node *node;
  value_type *pvVar4;
  bool bVar5;
  
  pNVar1 = this->nil;
  node = pNVar1->left;
  if (node != pNVar1) {
    do {
      lVar2 = node->value->first;
      if (lVar2 == value->first) break;
      node = (&node->left)[lVar2 <= value->first];
    } while (node != pNVar1);
  }
  bVar5 = node == pNVar1;
  if (bVar5) {
    node = (Node *)operator_new(0x28);
    pvVar4 = (value_type *)operator_new(0x10);
    pCVar3 = value->second;
    pvVar4->first = value->first;
    pvVar4->second = pCVar3;
    node->value = pvVar4;
    node->color = RED;
    node->left = (Node *)0x0;
    node->right = (Node *)0x0;
    node->parent = (Node *)0x0;
    insert(this,node);
  }
  (__return_storage_ptr__->first).cor = this;
  (__return_storage_ptr__->first).ptr = node;
  __return_storage_ptr__->second = bVar5;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator , bool> insert(const value_type &value)
	{
		Node *node = search(value.first);
		if (node == nil)
		{
			node = new Node (new value_type (value) , RED) , insert(node);
			return std::make_pair(iterator(this , node) , true);
		}
		else return std::make_pair(iterator(this , node) , false);
	}